

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTDMT_compressStream_generic
                 (ZSTDMT_CCtx *mtctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  size_t *psVar1;
  ZSTDMT_jobDescription *pZVar2;
  ZSTD_CCtx_params *__dest;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  ZSTD_EndDirective ZVar8;
  ulong uVar9;
  U64 UVar10;
  ulong uVar11;
  U64 UVar12;
  ZSTD_CDict *pZVar13;
  undefined2 *puVar14;
  ZSTDMT_jobDescription *pZVar15;
  XXH64_hash_t XVar16;
  ulong uVar17;
  size_t sVar18;
  uint uVar19;
  byte *pbVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong size;
  byte *pbVar24;
  BYTE *pBVar25;
  void *pvVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  buffer_t bVar29;
  buffer_t buffer;
  buffer_t buffer_00;
  range_t range;
  range_t range_00;
  buffer_t buffer_01;
  buffer_t buffer_02;
  buffer_t buf;
  BYTE *local_48;
  size_t __n;
  
  if (output->size < output->pos) {
    __assert_fail("output->pos <= output->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8bf4,
                  "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  uVar9 = input->size;
  uVar21 = input->pos;
  if (uVar9 < uVar21) {
    __assert_fail("input->pos <= input->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8bf5,
                  "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  if ((endOp == ZSTD_e_continue) && (mtctx->frameEnded != 0)) {
    return 0xffffffffffffffc4;
  }
  bVar27 = false;
  if ((uVar21 < uVar9) && (mtctx->jobReady == 0)) {
    pBVar25 = (BYTE *)(mtctx->inBuff).buffer.start;
    if (pBVar25 == (BYTE *)0x0) {
      if ((mtctx->inBuff).filled != 0) {
        __assert_fail("mtctx->inBuff.filled == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8c00,
                      "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
      uVar23 = mtctx->doneJobID;
      uVar19 = mtctx->nextJobID;
      do {
        if (uVar19 <= uVar23) {
          uVar9 = 0;
          pvVar26 = (void *)0x0;
          goto LAB_00162a46;
        }
        uVar6 = mtctx->jobIDMask & uVar23;
        pthread_mutex_lock((pthread_mutex_t *)&mtctx->jobs[uVar6].job_mutex);
        uVar21 = mtctx->jobs[uVar6].consumed;
        pthread_mutex_unlock((pthread_mutex_t *)&mtctx->jobs[uVar6].job_mutex);
        pZVar15 = mtctx->jobs;
        uVar9 = pZVar15[uVar6].src.size;
        uVar23 = uVar23 + 1;
      } while (uVar9 <= uVar21);
      uVar21 = pZVar15[uVar6].prefix.size;
      if (uVar21 != 0) {
        uVar9 = uVar21;
      }
      pvVar26 = (&pZVar15[uVar6].prefix)[uVar21 == 0].start;
      if (pZVar15[uVar6].src.start < pvVar26) {
        __assert_fail("range.start <= mtctx->jobs[wJobID].src.start",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8af4,"range_t ZSTDMT_getInputDataInUse(ZSTDMT_CCtx *)");
      }
LAB_00162a46:
      if ((mtctx->inBuff).buffer.start != (void *)0x0) {
        __assert_fail("mtctx->inBuff.buffer.start == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8b47,"int ZSTDMT_tryGetInputRange(ZSTDMT_CCtx *)");
      }
      uVar21 = mtctx->targetSectionSize;
      uVar5 = (mtctx->roundBuff).capacity;
      if (uVar5 < uVar21) {
        __assert_fail("mtctx->roundBuff.capacity >= target",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8b48,"int ZSTDMT_tryGetInputRange(ZSTDMT_CCtx *)");
      }
      __n = (mtctx->roundBuff).pos;
      if (uVar5 - __n < uVar21) {
        __n = (mtctx->inBuff).prefix.size;
        pBVar25 = (mtctx->roundBuff).buffer;
        bVar29.capacity = __n;
        bVar29.start = pBVar25;
        range.size = uVar9;
        range.start = pvVar26;
        iVar7 = ZSTDMT_isOverlapped(bVar29,range);
        if (iVar7 == 0) {
          buffer_01.capacity = __n;
          buffer_01.start = pBVar25;
          ZSTDMT_waitForLdmComplete(mtctx,buffer_01);
          memmove(pBVar25,(mtctx->inBuff).prefix.start,__n);
          (mtctx->inBuff).prefix.start = pBVar25;
          (mtctx->roundBuff).pos = __n;
          goto LAB_00162ad7;
        }
LAB_00162af0:
        if (mtctx->doneJobID == mtctx->nextJobID) {
          __assert_fail("mtctx->doneJobID != mtctx->nextJobID",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8c06,
                        "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                       );
        }
        pBVar25 = (BYTE *)(mtctx->inBuff).buffer.start;
      }
      else {
LAB_00162ad7:
        pBVar25 = (mtctx->roundBuff).buffer + __n;
        buffer.capacity = uVar21;
        buffer.start = pBVar25;
        range_00.size = uVar9;
        range_00.start = pvVar26;
        iVar7 = ZSTDMT_isOverlapped(buffer,range_00);
        if (iVar7 != 0) goto LAB_00162af0;
        buffer_00.capacity = uVar21;
        buffer_00.start = pBVar25;
        iVar7 = ZSTDMT_isOverlapped(buffer_00,(mtctx->inBuff).prefix);
        if (iVar7 != 0) {
          __assert_fail("!ZSTDMT_isOverlapped(buffer, mtctx->inBuff.prefix)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8b63,"int ZSTDMT_tryGetInputRange(ZSTDMT_CCtx *)");
        }
        buffer_02.capacity = uVar21;
        buffer_02.start = pBVar25;
        ZSTDMT_waitForLdmComplete(mtctx,buffer_02);
        (mtctx->inBuff).buffer.start = pBVar25;
        (mtctx->inBuff).buffer.capacity = uVar21;
        (mtctx->inBuff).filled = 0;
        if ((mtctx->roundBuff).capacity < uVar21 + (mtctx->roundBuff).pos) {
          __assert_fail("mtctx->roundBuff.pos + buffer.capacity <= mtctx->roundBuff.capacity",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8b71,"int ZSTDMT_tryGetInputRange(ZSTDMT_CCtx *)");
        }
      }
      if (pBVar25 == (BYTE *)0x0) {
        uVar21 = input->pos;
        bVar27 = false;
        goto LAB_00162dbd;
      }
      uVar9 = input->size;
      uVar21 = input->pos;
    }
    uVar9 = uVar9 - uVar21;
    uVar5 = mtctx->targetSectionSize;
    uVar17 = (mtctx->inBuff).filled;
    pvVar26 = (void *)(uVar21 + (long)input->src);
    uVar21 = uVar5 - uVar17;
    if (uVar9 < uVar21) {
      uVar21 = uVar9;
    }
    bVar27 = false;
    uVar22 = uVar21;
    if ((((mtctx->params).rsyncable != 0) && (0x1ffff < uVar9 + uVar17)) && (0x1f < uVar21 + uVar17)
       ) {
      UVar12 = (mtctx->rsync).primePower;
      uVar9 = (mtctx->rsync).hitMask;
      if (uVar17 < 0x20000) {
        size = -uVar17 + 0x20000;
        if (uVar17 < 0x1ffe1) {
          local_48 = (BYTE *)(-uVar17 + 0x1ffe0 + (long)pvVar26);
          UVar10 = ZSTD_rollingHash_compute(local_48,0x20);
        }
        else {
          local_48 = pBVar25 + (uVar17 - 0x20);
          UVar10 = ZSTD_rollingHash_compute(pBVar25 + size + uVar17 + -0x20,uVar17 - 0x1ffe0);
          UVar10 = ZSTD_rollingHash_append(UVar10,pvVar26,size);
        }
      }
      else {
        local_48 = pBVar25 + (uVar17 - 0x20);
        UVar10 = ZSTD_rollingHash_compute(local_48,0x20);
        uVar22 = 0;
        size = uVar22;
        if ((uVar9 & ~UVar10) == 0) {
          bVar27 = true;
          goto LAB_00162d70;
        }
      }
      uVar11 = uVar21;
      if (uVar21 < size) {
        uVar11 = size;
      }
      bVar27 = true;
      do {
        if (uVar21 <= size) {
          bVar27 = false;
          size = uVar11;
          uVar22 = uVar21;
          break;
        }
        if (uVar17 + size < 0x20000) {
          __assert_fail("mtctx->inBuff.filled + pos >= RSYNC_MIN_BLOCK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8bd5,
                        "syncPoint_t findSynchronizationPoint(const ZSTDMT_CCtx *, const ZSTD_inBuffer)"
                       );
        }
        pbVar20 = (byte *)((size - 0x20) + (long)pvVar26);
        pbVar24 = local_48 + size;
        if (0x1f < size) {
          pbVar24 = pbVar20;
        }
        UVar10 = (UVar10 - ((ulong)*pbVar24 + 10) * UVar12) * -0x30e44323485a9b9d +
                 (ulong)pbVar20[0x20] + 10;
        size = size + 1;
        uVar22 = size;
      } while ((uVar9 & ~UVar10) != 0);
      if ((0x1f < size) &&
         (UVar12 = ZSTD_rollingHash_compute((void *)((long)pvVar26 + (size - 0x20)),0x20),
         UVar12 != UVar10)) {
        __assert_fail("pos < RSYNC_LENGTH || ZSTD_rollingHash_compute(istart + pos - RSYNC_LENGTH, RSYNC_LENGTH) == hash"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8bdd,
                      "syncPoint_t findSynchronizationPoint(const ZSTDMT_CCtx *, const ZSTD_inBuffer)"
                     );
      }
    }
LAB_00162d70:
    if ((mtctx->inBuff).buffer.capacity < uVar5) {
      __assert_fail("mtctx->inBuff.buffer.capacity >= mtctx->targetSectionSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8c0f,
                    "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                   );
    }
    ZVar8 = ZSTD_e_flush;
    if (!bVar27) {
      ZVar8 = endOp;
    }
    if (endOp == ZSTD_e_continue) {
      endOp = ZVar8;
    }
    memcpy(pBVar25 + uVar17,pvVar26,uVar22);
    uVar21 = input->pos + uVar22;
    input->pos = uVar21;
    psVar1 = &(mtctx->inBuff).filled;
    *psVar1 = *psVar1 + uVar22;
    bVar27 = uVar22 != 0;
  }
LAB_00162dbd:
  if ((endOp == ZSTD_e_end) && (uVar21 < input->size)) {
    sVar18 = (mtctx->inBuff).filled;
    endOp = ZSTD_e_flush;
    if ((sVar18 != 0) && ((sVar18 != mtctx->targetSectionSize && ((mtctx->params).rsyncable == 0))))
    {
      __assert_fail("mtctx->inBuff.filled == 0 || mtctx->inBuff.filled == mtctx->targetSectionSize || mtctx->params.rsyncable"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8c1f,
                    "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                   );
    }
  }
  uVar9 = (mtctx->inBuff).filled;
  if (((mtctx->targetSectionSize <= uVar9 || mtctx->jobReady != 0) ||
      (endOp != ZSTD_e_continue && uVar9 != 0)) ||
     ((endOp == ZSTD_e_end && (mtctx->frameEnded == 0)))) {
    if (mtctx->targetSectionSize < uVar9) {
      __assert_fail("mtctx->inBuff.filled <= mtctx->targetSectionSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8c28,
                    "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                   );
    }
    uVar23 = mtctx->jobIDMask;
    uVar19 = uVar23 & mtctx->nextJobID;
    if (mtctx->doneJobID + uVar23 < mtctx->nextJobID) {
      if (uVar19 != (mtctx->doneJobID & uVar23)) {
        __assert_fail("(mtctx->nextJobID & mtctx->jobIDMask) == (mtctx->doneJobID & mtctx->jobIDMask)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8a36,
                      "size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx *, size_t, ZSTD_EndDirective)"
                     );
      }
    }
    else {
      if (mtctx->jobReady == 0) {
        pZVar15 = mtctx->jobs;
        pvVar26 = (mtctx->inBuff).buffer.start;
        pZVar15[uVar19].src.start = pvVar26;
        pZVar15[uVar19].src.size = uVar9;
        sVar18 = (mtctx->inBuff).prefix.size;
        pZVar15[uVar19].prefix.start = (mtctx->inBuff).prefix.start;
        pZVar15[uVar19].prefix.size = sVar18;
        __dest = &mtctx->jobs[uVar19].params;
        *(undefined8 *)((long)(__dest + -1) + 8) = 0;
        *(undefined8 *)((long)(__dest + -1) + 0x10) = 0;
        memcpy(__dest,&mtctx->params,0xd0);
        if (mtctx->nextJobID == 0) {
          pZVar13 = mtctx->cdict;
        }
        else {
          pZVar13 = (ZSTD_CDict *)0x0;
        }
        pZVar15 = mtctx->jobs;
        pZVar15[uVar19].cdict = pZVar13;
        pZVar15[uVar19].fullFrameSize = mtctx->frameContentSize;
        pZVar15[uVar19].dstBuff.start = (void *)0x0;
        pZVar15[uVar19].dstBuff.capacity = 0;
        pZVar15 = mtctx->jobs;
        uVar3 = mtctx->bufPool;
        uVar4 = mtctx->cctxPool;
        auVar28._8_4_ = (int)uVar3;
        auVar28._0_8_ = uVar4;
        auVar28._12_4_ = (int)((ulong)uVar3 >> 0x20);
        pZVar15[uVar19].cctxPool = (ZSTDMT_CCtxPool *)uVar4;
        pZVar15[uVar19].bufPool = (ZSTDMT_bufferPool *)auVar28._8_8_;
        pZVar15[uVar19].seqPool = mtctx->seqPool;
        pZVar15[uVar19].serial = &mtctx->serial;
        uVar23 = mtctx->nextJobID;
        pZVar15[uVar19].jobID = uVar23;
        pZVar15[uVar19].firstJob = (uint)(uVar23 == 0);
        pZVar15[uVar19].lastJob = (uint)(endOp == ZSTD_e_end);
        pZVar15[uVar19].frameChecksumNeeded =
             (uint)(((mtctx->params).fParams.checksumFlag != 0 && uVar23 != 0) &&
                   endOp == ZSTD_e_end);
        pZVar15[uVar19].dstFlushed = 0;
        psVar1 = &(mtctx->roundBuff).pos;
        *psVar1 = *psVar1 + uVar9;
        (mtctx->inBuff).filled = 0;
        (mtctx->inBuff).buffer.start = (void *)0x0;
        (mtctx->inBuff).buffer.capacity = 0;
        if (endOp == ZSTD_e_end) {
          (mtctx->inBuff).prefix.start = (void *)0x0;
          (mtctx->inBuff).prefix.size = 0;
          mtctx->frameEnded = (uint)(endOp == ZSTD_e_end);
          if (uVar23 == 0) {
            (mtctx->params).fParams.checksumFlag = 0;
          }
          else if (uVar9 == 0) {
            if (pZVar15[uVar19].lastJob != 1) {
              __assert_fail("job->lastJob == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x8a1f,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
            }
            pZVar15 = pZVar15 + uVar19;
            if ((pZVar15->src).size != 0) {
              __assert_fail("job->src.size == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x8a20,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
            }
            if (pZVar15->firstJob != 0) {
              __assert_fail("job->firstJob == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x8a21,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
            }
            if ((pZVar15->dstBuff).start != (void *)0x0) {
              __assert_fail("job->dstBuff.start == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x8a22,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
            }
            bVar29 = ZSTDMT_getBuffer(pZVar15->bufPool);
            puVar14 = (undefined2 *)bVar29.start;
            pZVar15->dstBuff = bVar29;
            if (puVar14 == (undefined2 *)0x0) {
              pZVar15->cSize = 0xffffffffffffffc0;
            }
            else {
              if (bVar29.capacity < 3) {
                __assert_fail("job->dstBuff.capacity >= ZSTD_blockHeaderSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x8a28,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
              }
              (pZVar15->src).start = (void *)0x0;
              (pZVar15->src).size = 0;
              *puVar14 = 1;
              *(undefined1 *)(puVar14 + 1) = 0;
              pZVar15->cSize = 3;
              if (pZVar15->consumed != 0) {
                __assert_fail("job->consumed == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x8a2c,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
              }
            }
            mtctx->nextJobID = mtctx->nextJobID + 1;
            goto LAB_0016318a;
          }
        }
        else {
          uVar21 = mtctx->targetPrefixSize;
          if (uVar9 <= mtctx->targetPrefixSize) {
            uVar21 = uVar9;
          }
          (mtctx->inBuff).prefix.start = (void *)((long)pvVar26 + (uVar9 - uVar21));
          (mtctx->inBuff).prefix.size = uVar21;
          if (uVar9 == 0 && uVar23 != 0) {
            __assert_fail("endOp == ZSTD_e_end",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8a66,
                          "size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx *, size_t, ZSTD_EndDirective)"
                         );
          }
        }
      }
      else {
        pZVar15 = mtctx->jobs;
      }
      iVar7 = POOL_tryAdd(mtctx->factory,ZSTDMT_compressionJob,pZVar15 + uVar19);
      if (iVar7 != 0) {
        mtctx->nextJobID = mtctx->nextJobID + 1;
      }
      mtctx->jobReady = (uint)(iVar7 == 0);
    }
  }
LAB_0016318a:
  if (output->size < output->pos) {
    __assert_fail("output->size >= output->pos",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8a89,
                  "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                 );
  }
  uVar23 = mtctx->jobIDMask & mtctx->doneJobID;
  pthread_mutex_lock((pthread_mutex_t *)&mtctx->jobs[uVar23].job_mutex);
  if (bVar27) {
    pZVar15 = mtctx->jobs;
  }
  else {
    pZVar15 = mtctx->jobs;
    if (mtctx->doneJobID < mtctx->nextJobID) {
      uVar9 = pZVar15[uVar23].cSize;
      uVar21 = pZVar15[uVar23].dstFlushed;
      if (uVar9 < uVar21) {
        __assert_fail("mtctx->jobs[wJobID].dstFlushed <= mtctx->jobs[wJobID].cSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8a8e,
                      "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                     );
      }
      while ((uVar21 == uVar9 && (pZVar2 = pZVar15 + uVar23, pZVar2->consumed != (pZVar2->src).size)
             )) {
        pthread_cond_wait((pthread_cond_t *)&pZVar2->job_cond,(pthread_mutex_t *)&pZVar2->job_mutex)
        ;
        pZVar15 = mtctx->jobs;
        uVar9 = pZVar15[uVar23].cSize;
        uVar21 = pZVar15[uVar23].dstFlushed;
      }
    }
  }
  pZVar15 = pZVar15 + uVar23;
  uVar9 = pZVar15->consumed;
  uVar21 = pZVar15->cSize;
  uVar5 = (pZVar15->src).size;
  pthread_mutex_unlock((pthread_mutex_t *)&pZVar15->job_mutex);
  if (0xffffffffffffff88 < uVar21) {
    ZSTDMT_waitForAllJobsCompleted(mtctx);
    ZSTDMT_releaseAllJobResources(mtctx);
    goto LAB_001633d5;
  }
  if (uVar5 < uVar9) {
    __assert_fail("srcConsumed <= srcSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8aa7,
                  "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                 );
  }
  pZVar15 = mtctx->jobs;
  if ((uVar9 == uVar5) && (pZVar15[uVar23].frameChecksumNeeded != 0)) {
    XVar16 = XXH_INLINE_XXH64_digest(&(mtctx->serial).xxhState);
    sVar18 = pZVar15[uVar23].cSize;
    *(int *)((long)pZVar15[uVar23].dstBuff.start + sVar18) = (int)XVar16;
    uVar21 = uVar21 + 4;
    pZVar15[uVar23].cSize = sVar18 + 4;
    pZVar15[uVar23].frameChecksumNeeded = 0;
LAB_001632c2:
    uVar17 = pZVar15[uVar23].dstFlushed;
    sVar18 = output->pos;
    uVar22 = output->size - sVar18;
    if (uVar21 - uVar17 < uVar22) {
      uVar22 = uVar21 - uVar17;
    }
    if (mtctx->nextJobID <= mtctx->doneJobID) {
      __assert_fail("mtctx->doneJobID < mtctx->nextJobID",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8ab6,
                    "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                   );
    }
    if (uVar21 < uVar17) {
      __assert_fail("cSize >= mtctx->jobs[wJobID].dstFlushed",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8ab7,
                    "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                   );
    }
    pvVar26 = pZVar15[uVar23].dstBuff.start;
    if (pvVar26 == (void *)0x0) {
      __assert_fail("mtctx->jobs[wJobID].dstBuff.start != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8ab8,
                    "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                   );
    }
    if (uVar22 != 0) {
      memcpy((void *)(sVar18 + (long)output->dst),(void *)((long)pvVar26 + uVar17),uVar22);
      sVar18 = output->pos;
      pZVar15 = mtctx->jobs;
      uVar17 = pZVar15[uVar23].dstFlushed;
    }
    uVar17 = uVar17 + uVar22;
    output->pos = sVar18 + uVar22;
    pZVar15[uVar23].dstFlushed = uVar17;
    if ((uVar9 == uVar5) && (uVar17 == uVar21)) {
      buf.capacity = pZVar15[uVar23].dstBuff.capacity;
      buf.start = pZVar15[uVar23].dstBuff.start;
      ZSTDMT_releaseBuffer(mtctx->bufPool,buf);
      pZVar15 = mtctx->jobs;
      pZVar15[uVar23].dstBuff.start = (void *)0x0;
      pZVar15[uVar23].dstBuff.capacity = 0;
      pZVar15 = mtctx->jobs;
      pZVar15[uVar23].cSize = 0;
      mtctx->consumed = mtctx->consumed + uVar9;
      mtctx->produced = mtctx->produced + uVar21;
      mtctx->doneJobID = mtctx->doneJobID + 1;
      uVar17 = pZVar15[uVar23].dstFlushed;
    }
    bVar27 = uVar17 <= uVar21;
    uVar21 = uVar21 - uVar17;
    if (bVar27 && uVar21 != 0) goto LAB_001633d5;
  }
  else if (uVar21 != 0) goto LAB_001632c2;
  uVar21 = 1;
  if ((((uVar5 <= uVar9) && (mtctx->nextJobID <= mtctx->doneJobID)) && (mtctx->jobReady == 0)) &&
     ((mtctx->inBuff).filled == 0)) {
    mtctx->allJobsCompleted = mtctx->frameEnded;
    if (endOp == ZSTD_e_end) {
      uVar21 = (ulong)(mtctx->frameEnded == 0);
    }
    else {
      uVar21 = 0;
    }
  }
LAB_001633d5:
  sVar18 = uVar21 + (uVar21 == 0);
  if (input->size <= input->pos) {
    sVar18 = uVar21;
  }
  return sVar18;
}

Assistant:

size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx* mtctx,
                                     ZSTD_outBuffer* output,
                                     ZSTD_inBuffer* input,
                                     ZSTD_EndDirective endOp)
{
    unsigned forwardInputProgress = 0;
    DEBUGLOG(5, "ZSTDMT_compressStream_generic (endOp=%u, srcSize=%u)",
                (U32)endOp, (U32)(input->size - input->pos));
    assert(output->pos <= output->size);
    assert(input->pos  <= input->size);

    if ((mtctx->frameEnded) && (endOp==ZSTD_e_continue)) {
        /* current frame being ended. Only flush/end are allowed */
        return ERROR(stage_wrong);
    }

    /* fill input buffer */
    if ( (!mtctx->jobReady)
      && (input->size > input->pos) ) {   /* support NULL input */
        if (mtctx->inBuff.buffer.start == NULL) {
            assert(mtctx->inBuff.filled == 0); /* Can't fill an empty buffer */
            if (!ZSTDMT_tryGetInputRange(mtctx)) {
                /* It is only possible for this operation to fail if there are
                 * still compression jobs ongoing.
                 */
                DEBUGLOG(5, "ZSTDMT_tryGetInputRange failed");
                assert(mtctx->doneJobID != mtctx->nextJobID);
            } else
                DEBUGLOG(5, "ZSTDMT_tryGetInputRange completed successfully : mtctx->inBuff.buffer.start = %p", mtctx->inBuff.buffer.start);
        }
        if (mtctx->inBuff.buffer.start != NULL) {
            syncPoint_t const syncPoint = findSynchronizationPoint(mtctx, *input);
            if (syncPoint.flush && endOp == ZSTD_e_continue) {
                endOp = ZSTD_e_flush;
            }
            assert(mtctx->inBuff.buffer.capacity >= mtctx->targetSectionSize);
            DEBUGLOG(5, "ZSTDMT_compressStream_generic: adding %u bytes on top of %u to buffer of size %u",
                        (U32)syncPoint.toLoad, (U32)mtctx->inBuff.filled, (U32)mtctx->targetSectionSize);
            ZSTD_memcpy((char*)mtctx->inBuff.buffer.start + mtctx->inBuff.filled, (const char*)input->src + input->pos, syncPoint.toLoad);
            input->pos += syncPoint.toLoad;
            mtctx->inBuff.filled += syncPoint.toLoad;
            forwardInputProgress = syncPoint.toLoad>0;
        }
    }
    if ((input->pos < input->size) && (endOp == ZSTD_e_end)) {
        /* Can't end yet because the input is not fully consumed.
            * We are in one of these cases:
            * - mtctx->inBuff is NULL & empty: we couldn't get an input buffer so don't create a new job.
            * - We filled the input buffer: flush this job but don't end the frame.
            * - We hit a synchronization point: flush this job but don't end the frame.
            */
        assert(mtctx->inBuff.filled == 0 || mtctx->inBuff.filled == mtctx->targetSectionSize || mtctx->params.rsyncable);
        endOp = ZSTD_e_flush;
    }

    if ( (mtctx->jobReady)
      || (mtctx->inBuff.filled >= mtctx->targetSectionSize)  /* filled enough : let's compress */
      || ((endOp != ZSTD_e_continue) && (mtctx->inBuff.filled > 0))  /* something to flush : let's go */
      || ((endOp == ZSTD_e_end) && (!mtctx->frameEnded)) ) {   /* must finish the frame with a zero-size block */
        size_t const jobSize = mtctx->inBuff.filled;
        assert(mtctx->inBuff.filled <= mtctx->targetSectionSize);
        FORWARD_IF_ERROR( ZSTDMT_createCompressionJob(mtctx, jobSize, endOp) , "");
    }

    /* check for potential compressed data ready to be flushed */
    {   size_t const remainingToFlush = ZSTDMT_flushProduced(mtctx, output, !forwardInputProgress, endOp); /* block if there was no forward input progress */
        if (input->pos < input->size) return MAX(remainingToFlush, 1);  /* input not consumed : do not end flush yet */
        DEBUGLOG(5, "end of ZSTDMT_compressStream_generic: remainingToFlush = %u", (U32)remainingToFlush);
        return remainingToFlush;
    }
}